

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_variableEqualById_Test::Equality_variableEqualById_Test
          (Equality_variableEqualById_Test *this)

{
  Equality_variableEqualById_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_variableEqualById_Test_001494e0;
  return;
}

Assistant:

TEST(Equality, variableEqualById)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    v1->setId("lefisjeij");
    v2->setId("lefisjeij");

    EXPECT_TRUE(v1->equals(v2));
    EXPECT_TRUE(v2->equals(v1));
}